

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loclikely.cpp
# Opt level: O0

char * findLikelySubtags(char *localeID,char *buffer,int32_t bufferLength,UErrorCode *err)

{
  UBool UVar1;
  UResourceBundle *resB;
  UResourceBundle *subtags;
  UChar *pUStack_40;
  UErrorCode tmpErr;
  UChar *s;
  char *pcStack_30;
  int32_t resLen;
  char *result;
  UErrorCode *err_local;
  char *pcStack_18;
  int32_t bufferLength_local;
  char *buffer_local;
  char *localeID_local;
  
  pcStack_30 = (char *)0x0;
  result = (char *)err;
  err_local._4_4_ = bufferLength;
  pcStack_18 = buffer;
  buffer_local = localeID;
  UVar1 = U_FAILURE(*err);
  if (UVar1 == '\0') {
    s._4_4_ = 0;
    pUStack_40 = (UChar *)0x0;
    subtags._4_4_ = U_ZERO_ERROR;
    resB = ures_openDirect_63((char *)0x0,"likelySubtags",(UErrorCode *)((long)&subtags + 4));
    UVar1 = U_SUCCESS(subtags._4_4_);
    if (UVar1 == '\0') {
      *(UErrorCode *)result = subtags._4_4_;
    }
    else {
      pUStack_40 = ures_getStringByKey_63
                             (resB,buffer_local,(int32_t *)((long)&s + 4),
                              (UErrorCode *)((long)&subtags + 4));
      UVar1 = U_FAILURE(subtags._4_4_);
      if (UVar1 == '\0') {
        if (s._4_4_ < err_local._4_4_) {
          u_UCharsToChars_63(pUStack_40,pcStack_18,s._4_4_ + 1);
          pcStack_30 = pcStack_18;
        }
        else {
          result[0] = '\x05';
          result[1] = '\0';
          result[2] = '\0';
          result[3] = '\0';
        }
      }
      else if (subtags._4_4_ != U_MISSING_RESOURCE_ERROR) {
        *(UErrorCode *)result = subtags._4_4_;
      }
      ures_close_63(resB);
    }
  }
  return pcStack_30;
}

Assistant:

static const char*  U_CALLCONV
findLikelySubtags(const char* localeID,
                  char* buffer,
                  int32_t bufferLength,
                  UErrorCode* err) {
    const char* result = NULL;

    if (!U_FAILURE(*err)) {
        int32_t resLen = 0;
        const UChar* s = NULL;
        UErrorCode tmpErr = U_ZERO_ERROR;
        UResourceBundle* subtags = ures_openDirect(NULL, "likelySubtags", &tmpErr);
        if (U_SUCCESS(tmpErr)) {
            s = ures_getStringByKey(subtags, localeID, &resLen, &tmpErr);

            if (U_FAILURE(tmpErr)) {
                /*
                 * If a resource is missing, it's not really an error, it's
                 * just that we don't have any data for that particular locale ID.
                 */
                if (tmpErr != U_MISSING_RESOURCE_ERROR) {
                    *err = tmpErr;
                }
            }
            else if (resLen >= bufferLength) {
                /* The buffer should never overflow. */
                *err = U_INTERNAL_PROGRAM_ERROR;
            }
            else {
                u_UCharsToChars(s, buffer, resLen + 1);
                result = buffer;
            }

            ures_close(subtags);
        } else {
            *err = tmpErr;
        }
    }

    return result;
}